

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_capability.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_3::IsSupportOptionalOpenCL_1_2(uint32_t capability)

{
  bool local_9;
  uint32_t capability_local;
  
  if ((capability == 10) || (capability == 0xd)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool IsSupportOptionalOpenCL_1_2(uint32_t capability) {
  switch (spv::Capability(capability)) {
    case spv::Capability::ImageBasic:
    case spv::Capability::Float64:
      return true;
    default:
      break;
  }
  return false;
}